

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACInfoWnd.cpp
# Opt level: O1

void __thiscall ACIWnd::SetAcKey(ACIWnd *this,FDKeyTy *_key)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  string local_38;
  
  ClearAcKey(this);
  (this->acKey).eKeyType = _key->eKeyType;
  std::__cxx11::string::_M_assign((string *)&(this->acKey).key);
  (this->acKey).num = _key->num;
  paVar1 = &local_38.field_2;
  pcVar2 = (this->acKey).key._M_dataplus._M_p;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar2,pcVar2 + (this->acKey).key._M_string_length);
  std::__cxx11::string::operator=((string *)&this->keyEntry,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  GetWndTitle_abi_cxx11_(&local_38,this);
  ImgWindow::SetWindowTitle((ImgWindow *)this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  LTImgWindow::ReturnKeyboardFocus(&this->super_LTImgWindow);
  DataRefs::LTSetAcKey((void *)0x0,(int)(this->acKey).num);
  return;
}

Assistant:

void ACIWnd::SetAcKey (const LTFlightData::FDKeyTy& _key)
{
    ClearAcKey();                   // clear a lot of data
    keyEntry = (acKey = _key);      // remember the key
    SetWindowTitle(GetWndTitle());  // set the window's title
    ReturnKeyboardFocus();          // give up keyboard focus in case we had it

    // set as 'selected' aircraft for debug output
    dataRefs.LTSetAcKey(reinterpret_cast<void*>(long(DR_AC_KEY)),
                        (int)acKey.num);
}